

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O1

void rpn_CheckHRAM(Expression *expr,Expression *src)

{
  uint uVar1;
  int32_t iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  undefined4 uVar12;
  bool bVar13;
  undefined2 uVar14;
  uint8_t *puVar15;
  
  iVar2 = src->val;
  uVar3 = *(undefined4 *)&src->field_0x4;
  uVar4 = *(undefined4 *)&src->reason;
  uVar5 = *(undefined4 *)((long)&src->reason + 4);
  bVar13 = src->isSymbol;
  uVar14 = *(undefined2 *)&src->field_0x12;
  uVar6 = *(undefined4 *)&src->field_0x14;
  uVar7 = *(undefined4 *)&src->rpn;
  uVar8 = *(undefined4 *)((long)&src->rpn + 4);
  uVar9 = src->rpnCapacity;
  uVar10 = src->rpnLength;
  uVar11 = src->rpnPatchSize;
  uVar12 = *(undefined4 *)&src->field_0x2c;
  expr->isKnown = src->isKnown;
  expr->isSymbol = bVar13;
  *(undefined2 *)&expr->field_0x12 = uVar14;
  *(undefined4 *)&expr->field_0x14 = uVar6;
  *(undefined4 *)&expr->rpn = uVar7;
  *(undefined4 *)((long)&expr->rpn + 4) = uVar8;
  expr->rpnCapacity = uVar9;
  expr->rpnLength = uVar10;
  expr->rpnPatchSize = uVar11;
  *(undefined4 *)&expr->field_0x2c = uVar12;
  expr->val = iVar2;
  *(undefined4 *)&expr->field_0x4 = uVar3;
  *(undefined4 *)&expr->reason = uVar4;
  *(undefined4 *)((long)&expr->reason + 4) = uVar5;
  expr->isSymbol = false;
  if (expr->isKnown == false) {
    expr->rpnPatchSize = expr->rpnPatchSize + 1;
    puVar15 = reserveSpace(expr,1);
    *puVar15 = '`';
    return;
  }
  uVar1 = expr->val;
  if ((uVar1 & 0xffffff00) == 0xff00) {
    expr->val = uVar1 & 0xff;
    return;
  }
  if (0xff < uVar1) {
    error("Source address $%x not between $FF00 to $FFFF\n");
    return;
  }
  return;
}

Assistant:

void rpn_CheckHRAM(struct Expression *expr, const struct Expression *src)
{
	*expr = *src;
	expr->isSymbol = false;

	if (!rpn_isKnown(expr)) {
		expr->rpnPatchSize++;
		*reserveSpace(expr, 1) = RPN_HRAM;
	} else if (expr->val >= 0xFF00 && expr->val <= 0xFFFF) {
		// That range is valid, but only keep the lower byte
		expr->val &= 0xFF;
	} else if (expr->val < 0 || expr->val > 0xFF) {
		error("Source address $%" PRIx32 " not between $FF00 to $FFFF\n", expr->val);
	}
}